

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimSeq.c
# Opt level: O2

void Raig_ManDelete(Raig_Man_t *p)

{
  Vec_IntFree(p->vCis2Ids);
  Vec_IntFree(p->vLos);
  Vec_IntFree(p->vLis);
  if (p->pFans0 != (int *)0x0) {
    free(p->pFans0);
    p->pFans0 = (int *)0x0;
  }
  if (p->pFans1 != (int *)0x0) {
    free(p->pFans1);
    p->pFans1 = (int *)0x0;
  }
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  if (p->pSims != (uint *)0x0) {
    free(p->pSims);
    p->pSims = (uint *)0x0;
  }
  free(p->pMems);
  free(p);
  return;
}

Assistant:

void Raig_ManDelete( Raig_Man_t * p )
{
    Vec_IntFree( p->vCis2Ids );
    Vec_IntFree( p->vLos );
    Vec_IntFree( p->vLis );
    ABC_FREE( p->pFans0 );
    ABC_FREE( p->pFans1 );
    ABC_FREE( p->pRefs );
    ABC_FREE( p->pSims );
    ABC_FREE( p->pMems );
    ABC_FREE( p );
}